

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O3

double __thiscall
MeshDenoisingBase::getMeanSquareAngleError
          (MeshDenoisingBase *this,TriMesh *DenoisedMesh,TriMesh *OriginalMesh)

{
  double dVar1;
  value_handle _idx;
  mesh_ptr pPVar2;
  PropertyT<OpenMesh::VectorT<double,_3>_> *pPVar3;
  const_reference pvVar4;
  undefined8 uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  FaceIter FVar10;
  FaceIter FVar11;
  undefined1 local_60 [8];
  FaceIter f_it2;
  FaceIter f_it1;
  double local_38;
  
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             DenoisedMesh);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)DenoisedMesh);
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             OriginalMesh);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)OriginalMesh);
  FVar10 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)DenoisedMesh);
  uVar6 = FVar10._8_8_;
  unique0x100003d2 = FVar10;
  _local_60 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)OriginalMesh);
  FVar11 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)DenoisedMesh);
  local_38 = 0.0;
  if (FVar10.hnd_.super_BaseHandle.idx_.super_BaseHandle !=
      (BaseHandle)FVar11.hnd_.super_BaseHandle.idx_ || FVar10.mesh_ != FVar11.mesh_) {
    local_38 = 0.0;
    do {
      pPVar3 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                         ((PropertyContainer *)
                          &(DenoisedMesh->super_Mesh).
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           .field_0x68,
                          (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                          (DenoisedMesh->super_Mesh).
                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          .
                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                          .face_normals_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                          super_BaseHandle.idx_);
      pvVar4 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[](pPVar3,(int)uVar6);
      dVar8 = (pvVar4->super_VectorDataT<double,_3>).values_[0];
      dVar7 = (pvVar4->super_VectorDataT<double,_3>).values_[1];
      dVar1 = (pvVar4->super_VectorDataT<double,_3>).values_[2];
      _idx.super_BaseHandle.idx_ = f_it2.mesh_._0_4_;
      pPVar3 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                         ((PropertyContainer *)
                          &(OriginalMesh->super_Mesh).
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           .field_0x68,
                          (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                          (OriginalMesh->super_Mesh).
                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          .
                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                          .face_normals_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                          super_BaseHandle.idx_);
      pvVar4 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                         (pPVar3,(int)_idx.super_BaseHandle.idx_);
      dVar7 = dVar1 * (pvVar4->super_VectorDataT<double,_3>).values_[2] +
              dVar7 * (pvVar4->super_VectorDataT<double,_3>).values_[1] +
              dVar8 * (pvVar4->super_VectorDataT<double,_3>).values_[0] + 0.0;
      dVar8 = -1.0;
      if (-1.0 <= dVar7) {
        dVar8 = dVar7;
      }
      if (1.0 <= dVar8) {
        dVar8 = 1.0;
      }
      dVar8 = acos(dVar8);
      pPVar2 = f_it1.mesh_;
      f_it1.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)f_it2._16_4_.super_BaseHandle + 1);
      if ((ulong)pPVar2 >> 0x20 != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)&f_it2.hnd_);
      }
      pPVar2 = f_it2.mesh_;
      f_it2.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)local_60._8_4_.super_BaseHandle + 1);
      if ((ulong)pPVar2 >> 0x20 != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)local_60);
      }
      local_38 = local_38 + (dVar8 * 180.0) / 3.141592653589793;
      FVar10 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)DenoisedMesh);
      uVar6 = (ulong)(uint)f_it1.mesh_._0_4_;
    } while (f_it1.mesh_._0_4_ != (BaseHandle)FVar10.hnd_.super_BaseHandle.idx_ ||
             (mesh_ptr)f_it2._8_8_ != FVar10.mesh_);
  }
  uVar5 = (**(code **)(*(long *)&(DenoisedMesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))(DenoisedMesh);
  auVar9._8_4_ = (int)((ulong)uVar5 >> 0x20);
  auVar9._0_8_ = uVar5;
  auVar9._12_4_ = 0x45300000;
  return local_38 /
         ((auVar9._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
}

Assistant:

double MeshDenoisingBase::getMeanSquareAngleError(TriMesh &DenoisedMesh, TriMesh &OriginalMesh)
{
    DenoisedMesh.request_face_normals();
    DenoisedMesh.update_face_normals();

    OriginalMesh.request_face_normals();
    OriginalMesh.update_face_normals();

    double mean_square_angle_error = 0.0;
    for (TriMesh::FaceIter f_it1 = DenoisedMesh.faces_begin(), f_it2 = OriginalMesh.faces_begin();
        f_it1 != DenoisedMesh.faces_end(); f_it1++, f_it2++ )
    {
        TriMesh::Normal normal1 = DenoisedMesh.normal(*f_it1);
        TriMesh::Normal normal2 = OriginalMesh.normal(*f_it2);
        double cross_value = normal1 | normal2;
        cross_value = std::min(1.0, std::max(cross_value, -1.0));
        mean_square_angle_error += std::acos(cross_value) * 180.0 / M_PI;
    }

    return mean_square_angle_error / (double)DenoisedMesh.n_faces();
}